

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPUDPv6Transmitter::JoinMulticastGroup(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  int iVar1;
  in6_addr mcastIP;
  anon_union_16_3_a3f0114d_for___in6_u local_38;
  ipv6_mreq mreq;
  
  if (this->init != true) {
    return -0x72;
  }
  if (this->created == true) {
    if (addr->addresstype == IPv6Address) {
      local_38.__u6_addr8[0] = addr->field_0xc;
      local_38.__u6_addr8[1] = addr->field_0xd;
      local_38.__u6_addr8[2] = addr->field_0xe;
      local_38.__u6_addr8[3] = addr->field_0xf;
      local_38.__u6_addr8[4] = *(undefined1 *)&addr[1]._vptr_RTPAddress;
      local_38.__u6_addr8[5] = *(uint8_t *)((long)&addr[1]._vptr_RTPAddress + 1);
      local_38.__u6_addr8[6] = *(uint8_t *)((long)&addr[1]._vptr_RTPAddress + 2);
      local_38.__u6_addr8[7] = *(uint8_t *)((long)&addr[1]._vptr_RTPAddress + 3);
      local_38.__u6_addr8[8] = *(uint8_t *)((long)&addr[1]._vptr_RTPAddress + 4);
      local_38.__u6_addr8[9] = *(uint8_t *)((long)&addr[1]._vptr_RTPAddress + 5);
      local_38.__u6_addr8[10] = *(uint8_t *)((long)&addr[1]._vptr_RTPAddress + 6);
      local_38.__u6_addr8[0xb] = *(uint8_t *)((long)&addr[1]._vptr_RTPAddress + 7);
      local_38.__u6_addr8[0xc] = (uint8_t)addr[1].addresstype;
      local_38.__u6_addr8[0xd] = *(byte *)((long)&addr[1].addresstype + 1);
      local_38.__u6_addr8[0xe] = *(byte *)((long)&addr[1].addresstype + 2);
      local_38.__u6_addr8[0xf] = *(byte *)((long)&addr[1].addresstype + 3);
      if (local_38.__u6_addr8[0] == 0xff) {
        iVar1 = RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
                AddElement(&this->multicastgroups,(in6_addr *)&local_38);
        if (-1 < iVar1) {
          mreq.ipv6mr_multiaddr.__in6_u._0_8_ =
               CONCAT17(local_38.__u6_addr8[7],
                        CONCAT16(local_38.__u6_addr8[6],
                                 CONCAT15(local_38.__u6_addr8[5],
                                          CONCAT14(local_38.__u6_addr8[4],
                                                   CONCAT13(local_38.__u6_addr8[3],
                                                            CONCAT12(local_38.__u6_addr8[2],
                                                                     CONCAT11(local_38.__u6_addr8[1]
                                                                              ,local_38.__u6_addr8
                                                                               [0])))))));
          mreq.ipv6mr_multiaddr.__in6_u._8_8_ =
               CONCAT17(local_38.__u6_addr8[0xf],
                        CONCAT16(local_38.__u6_addr8[0xe],
                                 CONCAT15(local_38.__u6_addr8[0xd],
                                          CONCAT14(local_38.__u6_addr8[0xc],
                                                   CONCAT13(local_38.__u6_addr8[0xb],
                                                            CONCAT12(local_38.__u6_addr8[10],
                                                                     CONCAT11(local_38.__u6_addr8[9]
                                                                              ,local_38.__u6_addr8
                                                                               [8])))))));
          mreq.ipv6mr_interface = this->mcastifidx;
          iVar1 = setsockopt(this->rtpsock,0x29,0x14,&mreq,0x14);
          if (iVar1 == 0) {
            mreq.ipv6mr_multiaddr.__in6_u._0_8_ =
                 CONCAT17(local_38.__u6_addr8[7],
                          CONCAT16(local_38.__u6_addr8[6],
                                   CONCAT15(local_38.__u6_addr8[5],
                                            CONCAT14(local_38.__u6_addr8[4],
                                                     CONCAT13(local_38.__u6_addr8[3],
                                                              CONCAT12(local_38.__u6_addr8[2],
                                                                       CONCAT11(local_38.__u6_addr8
                                                                                [1],local_38.
                                                  __u6_addr8[0])))))));
            mreq.ipv6mr_multiaddr.__in6_u._8_8_ =
                 CONCAT17(local_38.__u6_addr8[0xf],
                          CONCAT16(local_38.__u6_addr8[0xe],
                                   CONCAT15(local_38.__u6_addr8[0xd],
                                            CONCAT14(local_38.__u6_addr8[0xc],
                                                     CONCAT13(local_38.__u6_addr8[0xb],
                                                              CONCAT12(local_38.__u6_addr8[10],
                                                                       CONCAT11(local_38.__u6_addr8
                                                                                [9],local_38.
                                                  __u6_addr8[8])))))));
            mreq.ipv6mr_interface = this->mcastifidx;
            iVar1 = setsockopt(this->rtcpsock,0x29,0x14,&mreq,0x14);
            if (iVar1 == 0) {
              return 0;
            }
            mreq.ipv6mr_multiaddr.__in6_u._0_8_ =
                 CONCAT17(local_38.__u6_addr8[7],
                          CONCAT16(local_38.__u6_addr8[6],
                                   CONCAT15(local_38.__u6_addr8[5],
                                            CONCAT14(local_38.__u6_addr8[4],
                                                     CONCAT13(local_38.__u6_addr8[3],
                                                              CONCAT12(local_38.__u6_addr8[2],
                                                                       CONCAT11(local_38.__u6_addr8
                                                                                [1],local_38.
                                                  __u6_addr8[0])))))));
            mreq.ipv6mr_multiaddr.__in6_u._8_8_ =
                 CONCAT17(local_38.__u6_addr8[0xf],
                          CONCAT16(local_38.__u6_addr8[0xe],
                                   CONCAT15(local_38.__u6_addr8[0xd],
                                            CONCAT14(local_38.__u6_addr8[0xc],
                                                     CONCAT13(local_38.__u6_addr8[0xb],
                                                              CONCAT12(local_38.__u6_addr8[10],
                                                                       CONCAT11(local_38.__u6_addr8
                                                                                [9],local_38.
                                                  __u6_addr8[8])))))));
            mreq.ipv6mr_interface = this->mcastifidx;
            setsockopt(this->rtpsock,0x29,0x15,&mreq,0x14);
          }
          RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
          DeleteElement(&this->multicastgroups,(in6_addr *)&local_38);
          iVar1 = -0x69;
        }
      }
      else {
        iVar1 = -0x70;
      }
    }
    else {
      iVar1 = -0x6c;
    }
  }
  else {
    iVar1 = -0x71;
  }
  return iVar1;
}

Assistant:

int RTPUDPv6Transmitter::JoinMulticastGroup(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv6Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_INVALIDADDRESSTYPE;
	}
	
	const RTPIPv6Address &address = (const RTPIPv6Address &)addr;
	in6_addr mcastIP = address.GetIP();
	
	if (!RTPUDPV6TRANS_IS_MCASTADDR(mcastIP))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTAMULTICASTADDRESS;
	}
	
	status = multicastgroups.AddElement(mcastIP);
	if (status >= 0)
	{
		RTPUDPV6TRANS_MCASTMEMBERSHIP(rtpsock,IPV6_JOIN_GROUP,mcastIP,status);
		if (status != 0)
		{
			multicastgroups.DeleteElement(mcastIP);
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV6TRANS_COULDNTJOINMULTICASTGROUP;
		}
		RTPUDPV6TRANS_MCASTMEMBERSHIP(rtcpsock,IPV6_JOIN_GROUP,mcastIP,status);
		if (status != 0)
		{
			RTPUDPV6TRANS_MCASTMEMBERSHIP(rtpsock,IPV6_LEAVE_GROUP,mcastIP,status);
			multicastgroups.DeleteElement(mcastIP);
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV6TRANS_COULDNTJOINMULTICASTGROUP;
		}
	}
	MAINMUTEX_UNLOCK	
	return status;
}